

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  uint32_t uVar1;
  secp256k1_fe *in_RDI;
  int n;
  secp256k1_fe zero;
  uint32_t in_stack_ffffffffffffffc4;
  secp256k1_fe local_38;
  secp256k1_fe *local_8;
  
  local_8 = in_RDI;
  uVar1 = testrand_int(in_stack_ffffffffffffffc4);
  secp256k1_fe_impl_normalize(local_8);
  if (uVar1 != 0) {
    secp256k1_fe_impl_clear(&local_38);
    secp256k1_fe_impl_negate_unchecked(&local_38,&local_38,0);
    secp256k1_fe_impl_mul_int_unchecked(&local_38,uVar1 - 1);
    secp256k1_fe_impl_add(local_8,&local_38);
  }
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_clear(&zero);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}